

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

void __thiscall MallocBlock::Initialize(MallocBlock *this,size_t size,int type)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  SpinLock SVar4;
  byte bVar5;
  ThreadCache *pTVar6;
  AllocMap *pAVar7;
  FreeList *pFVar8;
  Object *__s;
  undefined8 uVar9;
  char *pcVar10;
  MallocBlock *cthis;
  uint uVar11;
  ulong uVar12;
  long *in_FS_OFFSET;
  bool bVar13;
  ThreadCachePtr TVar14;
  
  if ((this->magic1_ != 0xabcdefab) && (this->magic1_ != 0xdeadbeef)) {
    pcVar10 = "Check failed: IsValidMagicValue(magic1_): \n";
    uVar9 = 0x2b;
    goto LAB_0011b24f;
  }
  LOCK();
  bVar13 = (__atomic_base<int>)alloc_map_lock_.lockword_.super___atomic_base<int>._M_i ==
           (__atomic_base<int>)0x0;
  if (bVar13) {
    alloc_map_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar13) {
    SpinLock::SlowLock(&alloc_map_lock_);
  }
  if (alloc_map_ == (AllocMap *)0x0) {
    pTVar6 = (ThreadCache *)*in_FS_OFFSET;
    if (pTVar6 == (ThreadCache *)0x0) {
      TVar14 = tcmalloc::ThreadCachePtr::GetSlow();
      pTVar6 = TVar14.ptr_;
    }
    bVar5 = DAT_001423cd;
    uVar11 = (uint)DAT_001423cd;
    iVar1 = (&DAT_00142e44)[uVar11];
    uVar12 = (ulong)iVar1;
    uVar2 = (pTVar6->sampler_).bytes_until_sample_;
    if (uVar2 < uVar12) {
      bVar13 = tcmalloc::Sampler::RecordAllocationSlow(&pTVar6->sampler_,uVar12);
      if (bVar13) goto LAB_0011b024;
      pAVar7 = (AllocMap *)DoSampledAllocation(0x28);
    }
    else {
      (pTVar6->sampler_).bytes_until_sample_ = uVar2 - uVar12;
LAB_0011b024:
      pAVar7 = (AllocMap *)pTVar6->list_[bVar5].list_;
      if (pAVar7 == (AllocMap *)0x0) {
        pAVar7 = (AllocMap *)
                 tcmalloc::ThreadCache::FetchFromCentralCache
                           (pTVar6,uVar11,iVar1,anon_unknown.dwarf_5160::nop_oom_handler);
      }
      else {
        pFVar8 = pTVar6->list_ + bVar5;
        pFVar8->list_ = pAVar7->hashtable_;
        uVar11 = pFVar8->length_ - 1;
        pFVar8->length_ = uVar11;
        if (uVar11 < pFVar8->lowater_) {
          pFVar8->lowater_ = uVar11;
        }
        pTVar6->size_ = pTVar6->size_ - iVar1;
      }
    }
    pAVar7->free_ = (Entry *)0x0;
    pAVar7->alloc_ = anon_unknown.dwarf_5160::do_malloc;
    pAVar7->dealloc_ = anon_unknown.dwarf_5160::do_free;
    pAVar7->allocated_ = (Object *)0x0;
    pTVar6 = (ThreadCache *)*in_FS_OFFSET;
    if (pTVar6 == (ThreadCache *)0x0) {
      TVar14 = tcmalloc::ThreadCachePtr::GetSlow();
      pTVar6 = TVar14.ptr_;
    }
    bVar5 = DAT_00142541;
    uVar11 = (uint)DAT_00142541;
    iVar1 = (&DAT_00142e44)[uVar11];
    uVar12 = (ulong)iVar1;
    uVar2 = (pTVar6->sampler_).bytes_until_sample_;
    if (uVar2 < uVar12) {
      bVar13 = tcmalloc::Sampler::RecordAllocationSlow(&pTVar6->sampler_,uVar12);
      if (bVar13) goto LAB_0011b0f1;
      __s = (Object *)DoSampledAllocation(0x8008);
    }
    else {
      (pTVar6->sampler_).bytes_until_sample_ = uVar2 - uVar12;
LAB_0011b0f1:
      __s = (Object *)pTVar6->list_[bVar5].list_;
      if (__s == (Object *)0x0) {
        __s = (Object *)
              tcmalloc::ThreadCache::FetchFromCentralCache
                        (pTVar6,uVar11,iVar1,anon_unknown.dwarf_5160::nop_oom_handler);
      }
      else {
        pFVar8 = pTVar6->list_ + bVar5;
        pFVar8->list_ = __s->next;
        uVar11 = pFVar8->length_ - 1;
        pFVar8->length_ = uVar11;
        if (uVar11 < pFVar8->lowater_) {
          pFVar8->lowater_ = uVar11;
        }
        pTVar6->size_ = pTVar6->size_ - iVar1;
      }
    }
    memset(__s,0,0x8008);
    __s->next = pAVar7->allocated_;
    pAVar7->allocated_ = __s;
    pAVar7->hashtable_ = (Cluster **)(__s + 1);
    alloc_map_ = pAVar7;
  }
  AddressMap<int>::Insert(alloc_map_,this->size_and_magic2_,type);
  this->size1_ = size;
  this->offset_ = 0;
  this->alloc_type_ = (long)type;
  if (this->magic1_ != 0xabcdefab) {
    *(size_t *)((long)this->size_and_magic2_ + size + 8) = this->magic1_;
    *(size_t *)((long)this->size_and_magic2_ + this->size1_) = size;
  }
  SVar4.lockword_.super___atomic_base<int>._M_i =
       alloc_map_lock_.lockword_.super___atomic_base<int>._M_i;
  LOCK();
  alloc_map_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x0;
  UNLOCK();
  if ((__atomic_base<int>)SVar4.lockword_.super___atomic_base<int>._M_i != (__atomic_base<int>)0x1)
  {
    SpinLock::SlowUnlock(&alloc_map_lock_);
  }
  memset(this->size_and_magic2_,0xab,size);
  if (this->magic1_ == 0xabcdefab) {
    return;
  }
  sVar3 = this->size1_;
  if (sVar3 == *(size_t *)((long)this->size_and_magic2_ + sVar3)) {
    if (this->magic1_ == *(size_t *)((long)this->size_and_magic2_ + sVar3 + 8)) {
      return;
    }
    pcVar10 = "Check failed: memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0: should hold\n";
    uVar9 = 0x51;
  }
  else {
    pcVar10 = "Check failed: memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0: should hold\n";
    uVar9 = 0x4e;
  }
LAB_0011b24f:
  syscall(1,2,pcVar10,uVar9);
  abort();
}

Assistant:

void Initialize(size_t size, int type) {
    RAW_CHECK(IsValidMagicValue(magic1_), "");
    // record us as allocated in the map
    alloc_map_lock_.Lock();
    if (!alloc_map_) {
      void* p = do_malloc(sizeof(AllocMap));
      alloc_map_ = new(p) AllocMap(do_malloc, do_free);
    }
    alloc_map_->Insert(data_addr(), type);
    // initialize us
    size1_ = size;
    offset_ = 0;
    alloc_type_ = type;
    if (!IsMMapped()) {
      bit_store(magic2_addr(), &magic1_);
      bit_store(size2_addr(), &size);
    }
    alloc_map_lock_.Unlock();
    memset(data_addr(), kMagicUninitializedByte, size);
    if (!IsMMapped()) {
      RAW_CHECK(memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0, "should hold");
      RAW_CHECK(memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0, "should hold");
    }
  }